

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap> *this,double t)

{
  undefined1 local_28 [8];
  Sample s;
  double t_local;
  TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap> *this_local;
  
  s._8_8_ = t;
  Sample::Sample((Sample *)local_28);
  local_28._0_4_ = s.value;
  local_28[4] = s.blocked;
  local_28._5_3_ = s._13_3_;
  s.t._4_1_ = 1;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample>>
              *)this,(Sample *)local_28);
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }